

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

bool __thiscall
TasGrid::GridLocalPolynomial::addParent<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          Data2D<int> *destination)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  bool local_5d;
  bool added;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> dad;
  Data2D<int> *destination_local;
  MultiIndexSet *exclude_local;
  int direction_local;
  int *point_local;
  GridLocalPolynomial *this_local;
  
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)destination;
  ::std::allocator<int>::allocator(&local_49);
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_48,point,point + iVar2,&local_49);
  ::std::allocator<int>::~allocator(&local_49);
  local_5d = false;
  iVar2 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)2>(point[direction]);
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,(long)direction);
  *pvVar3 = iVar2;
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,(long)direction);
  if ((*pvVar3 != -1) &&
     (bVar1 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)local_48), bVar1))
  {
    Data2D<int>::appendStrip
              ((Data2D<int> *)
               dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_48);
    local_5d = true;
  }
  iVar2 = RuleLocal::getStepParent<(TasGrid::RuleLocal::erule)2>(point[direction]);
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,(long)direction);
  *pvVar3 = iVar2;
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,(long)direction);
  if ((*pvVar3 != -1) &&
     (bVar1 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)local_48), bVar1))
  {
    Data2D<int>::appendStrip
              ((Data2D<int> *)
               dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_48);
    local_5d = true;
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return local_5d;
}

Assistant:

bool GridLocalPolynomial::addParent(const int point[], int direction, const MultiIndexSet &exclude, Data2D<int> &destination) const{
    std::vector<int> dad(point, point + num_dimensions);
    bool added = false;
    dad[direction] = RuleLocal::getParent<effrule>(point[direction]);
    if ((dad[direction] != -1) && exclude.missing(dad)){
        destination.appendStrip(dad);
        added = true;
    }
    dad[direction] = RuleLocal::getStepParent<effrule>(point[direction]);
    if ((dad[direction] != -1) && exclude.missing(dad)){
        destination.appendStrip(dad);
        added = true;
    }
    return added;
}